

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.H
# Opt level: O3

void __thiscall amrex::EB2::GFab::define(GFab *this,Box *vbx)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int i;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  BaseFab<unsigned_int> *this_00;
  int iVar11;
  int iVar12;
  Box bx;
  Box local_78;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  uVar8 = *(undefined8 *)(vbx->smallend).vect;
  uVar2 = *(undefined8 *)((vbx->smallend).vect + 2);
  uVar3 = *(undefined8 *)((vbx->bigend).vect + 2);
  *(undefined8 *)(this->m_validbox).bigend.vect = *(undefined8 *)(vbx->bigend).vect;
  *(undefined8 *)((this->m_validbox).bigend.vect + 2) = uVar3;
  *(undefined8 *)(this->m_validbox).smallend.vect = uVar8;
  *(undefined8 *)((this->m_validbox).smallend.vect + 2) = uVar2;
  uVar6 = (vbx->btype).itype;
  local_4c = (vbx->bigend).vect[1] + 2;
  local_50 = (vbx->bigend).vect[2] + 2;
  local_78.smallend.vect[0] = (vbx->smallend).vect[0] + -2;
  local_78.smallend.vect[1] = (vbx->smallend).vect[1] + -2;
  local_78.smallend.vect[2] = (vbx->smallend).vect[2] + -2;
  iStack_3c = (vbx->bigend).vect[0] + 2;
  local_78.bigend.vect[0] = iStack_3c;
  local_78.bigend.vect[1] = local_4c;
  local_78.bigend.vect[2] = local_50;
  lVar7 = 0;
  do {
    if ((uVar6 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
      piVar1 = local_78.bigend.vect + lVar7;
      *piVar1 = *piVar1 + 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_78.btype.itype = 7;
  lVar7 = 0;
  local_48 = local_78.smallend.vect[0];
  iStack_44 = local_78.smallend.vect[1];
  iStack_40 = local_78.smallend.vect[2];
  BaseFab<double>::resize(&this->m_levelset,&local_78,1,(Arena *)0x0);
  iVar5 = iStack_40;
  iVar4 = iStack_44;
  local_58 = (int)(uVar6 << 0x1e) >> 0x1f;
  local_54 = (int)(uVar6 << 0x1d) >> 0x1f;
  iVar11 = iStack_3c - (uVar6 & 1);
  this_00 = (this->m_edgetype)._M_elems;
  local_5c = local_48;
  do {
    iVar12 = (int)lVar7;
    if (iVar12 == 1) {
      uVar6 = 2;
      iVar9 = 0;
      uVar8 = 0x100000000;
    }
    else if (iVar12 == 0) {
      uVar8 = 1;
      iVar9 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 4;
      iVar9 = 1;
      uVar8 = 0;
    }
    local_78.smallend.vect[0] = local_5c;
    local_78.smallend.vect[1] = iVar4;
    local_78.smallend.vect[2] = iVar5;
    local_78.bigend.vect[0] = (uint)uVar8 + iVar11;
    local_78.bigend.vect[1] = (int)((ulong)uVar8 >> 0x20) + local_58 + local_4c;
    local_78.bigend.vect[2] = iVar9 + local_54 + local_50;
    local_78.btype.itype = uVar6 | (uint)uVar8;
    iVar9 = 1;
    BaseFab<unsigned_int>::resize(this_00 + -3,&local_78,1,(Arena *)0x0);
    uVar10 = 4;
    uVar6 = 2;
    if (iVar12 == 0) {
      uVar8 = 0x100000000;
    }
    else if (iVar12 == 1) {
      uVar8 = 1;
      uVar6 = 0;
    }
    else {
      uVar8 = 0x100000001;
      uVar10 = 0;
      iVar9 = 0;
    }
    local_78.smallend.vect[0] = local_5c;
    local_78.smallend.vect[1] = iVar4;
    local_78.smallend.vect[2] = iVar5;
    local_78.bigend.vect[0] = (uint)uVar8 + iVar11;
    local_78.bigend.vect[1] = (int)((ulong)uVar8 >> 0x20) + local_58 + local_4c;
    local_78.bigend.vect[2] = iVar9 + local_54 + local_50;
    local_78.btype.itype = uVar6 | uVar10 | (uint)uVar8;
    BaseFab<unsigned_int>::resize(this_00,&local_78,1,(Arena *)0x0);
    lVar7 = lVar7 + 1;
    this_00 = this_00 + 1;
  } while (lVar7 != 3);
  return;
}

Assistant:

void define(const Box& vbx) {
        m_validbox = vbx;
        const Box& bxg2 = amrex::grow(vbx,ng);
        m_levelset.resize(amrex::surroundingNodes(bxg2));
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            m_facetype[idim].resize(amrex::convert(bxg2,IntVect::TheDimensionVector(idim)));
#if (AMREX_SPACEDIM == 3)
            m_edgetype[idim].resize(amrex::convert(bxg2,IntVect::TheNodeVector()
                                                       -IntVect::TheDimensionVector(idim)));
#endif
        }
    }